

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall CServerBrowser::Init(CServerBrowser *this,CNetClient *pNetClient,char *pNetVersion)

{
  IKernel *pIVar1;
  IConsole *pConsole;
  CConfig *pConfig;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  IConfigManager *pConfigManager;
  
  pIVar1 = (this->super_IServerBrowser).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"config");
  pConfigManager = (IConfigManager *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(pConfigManager->super_IInterface)._vptr_IInterface[6])(pConfigManager);
  this->m_pConfig = (CConfig *)CONCAT44(extraout_var_00,iVar2);
  pIVar1 = (this->super_IServerBrowser).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"console");
  this->m_pConsole = (IConsole *)CONCAT44(extraout_var_01,iVar2);
  pIVar1 = (this->super_IServerBrowser).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"storage");
  this->m_pStorage = (IStorage *)CONCAT44(extraout_var_02,iVar2);
  pIVar1 = (this->super_IServerBrowser).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"masterserver");
  this->m_pMasterServer = (IMasterServer *)CONCAT44(extraout_var_03,iVar2);
  pIVar1 = (this->super_IServerBrowser).super_IInterface.m_pKernel;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"mapchecker");
  this->m_pMapChecker = (IMapChecker *)CONCAT44(extraout_var_04,iVar2);
  this->m_pNetClient = pNetClient;
  pIVar1 = (this->super_IServerBrowser).super_IInterface.m_pKernel;
  pConsole = this->m_pConsole;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"engine");
  CServerBrowserFavorites::Init
            (&this->m_ServerBrowserFavorites,pNetClient,pConsole,
             (IEngine *)CONCAT44(extraout_var_05,iVar2),pConfigManager);
  pIVar1 = (this->super_IServerBrowser).super_IInterface.m_pKernel;
  pConfig = this->m_pConfig;
  iVar2 = (*pIVar1->_vptr_IKernel[2])(pIVar1,"friends");
  CServerBrowserFilter::Init
            (&this->m_ServerBrowserFilter,pConfig,(IFriends *)CONCAT44(extraout_var_06,iVar2),
             pNetVersion);
  return;
}

Assistant:

void CServerBrowser::Init(class CNetClient *pNetClient, const char *pNetVersion)
{
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	m_pConfig = pConfigManager->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pMasterServer = Kernel()->RequestInterface<IMasterServer>();
	m_pMapChecker = Kernel()->RequestInterface<IMapChecker>();
	m_pNetClient = pNetClient;

	m_ServerBrowserFavorites.Init(pNetClient, m_pConsole, Kernel()->RequestInterface<IEngine>(), pConfigManager);
	m_ServerBrowserFilter.Init(Config(), Kernel()->RequestInterface<IFriends>(), pNetVersion);
}